

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_file_list(BigFile *bf,char ***blocknames,int *Nblocks)

{
  bblist *pbVar1;
  char **ppcVar2;
  char *pcVar3;
  int local_38;
  int local_34;
  int i;
  int N;
  bblist *p;
  bblist *bblist;
  int *Nblocks_local;
  char ***blocknames_local;
  BigFile *bf_local;
  
  p = listbigfile_r(bf->basename,"",(bblist *)0x0);
  local_34 = 0;
  for (_i = p; _i != (bblist *)0x0; _i = _i->next) {
    local_34 = local_34 + 1;
  }
  *Nblocks = local_34;
  ppcVar2 = (char **)malloc((long)local_34 << 3);
  *blocknames = ppcVar2;
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    pcVar3 = _strdup(p->blockname);
    (*blocknames)[local_38] = pcVar3;
    pbVar1 = p->next;
    free(p);
    p = pbVar1;
  }
  return 0;
}

Assistant:

int
big_file_list(BigFile * bf, char *** blocknames, int * Nblocks)
{
    struct bblist * bblist = listbigfile_r(bf->basename, "", NULL);
    struct bblist * p;
    int N = 0;
    int i;
    for(p = bblist; p; p = p->next) {
        N ++;
    }
    *Nblocks = N;
    *blocknames = malloc(sizeof(char*) * N);
    for(i = 0; i < N; i ++) {
        (*blocknames)[i] = _strdup(bblist->blockname);
        p = bblist;
        bblist = bblist->next;
        free(p); 
    }
    return 0;
}